

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O2

void __thiscall spvtools::opt::IRContext::BuildTypeManager(IRContext *this)

{
  byte *pbVar1;
  pointer __p;
  IRContext *local_20;
  pointer local_18;
  
  local_20 = this;
  MakeUnique<spvtools::opt::analysis::TypeManager,std::function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>const&,spvtools::opt::IRContext*>
            ((spvtools *)&local_18,&this->consumer_,&local_20);
  __p = local_18;
  local_18 = (pointer)0x0;
  std::
  __uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
  ::reset((__uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
           *)&this->type_mgr_,__p);
  std::
  unique_ptr<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
  ::~unique_ptr((unique_ptr<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                 *)&local_18);
  pbVar1 = (byte *)((long)&this->valid_analyses_ + 1);
  *pbVar1 = *pbVar1 | 0x80;
  return;
}

Assistant:

void BuildTypeManager() {
    type_mgr_ = MakeUnique<analysis::TypeManager>(consumer(), this);
    valid_analyses_ = valid_analyses_ | kAnalysisTypes;
  }